

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_callback.hpp
# Opt level: O0

void __thiscall
asio::ssl::detail::verify_callback<asio::ssl::rfc2818_verification>::~verify_callback
          (verify_callback<asio::ssl::rfc2818_verification> *this)

{
  verify_callback<asio::ssl::rfc2818_verification> *this_local;
  
  (this->super_verify_callback_base)._vptr_verify_callback_base =
       (_func_int **)&PTR__verify_callback_00468418;
  rfc2818_verification::~rfc2818_verification(&this->callback_);
  verify_callback_base::~verify_callback_base(&this->super_verify_callback_base);
  return;
}

Assistant:

explicit verify_callback(VerifyCallback callback)
    : callback_(callback)
  {
  }